

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::
permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<int,false,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin)

{
  allocator<unsigned_long> *this_00;
  value_type vVar1;
  value_type vVar2;
  bool assertion;
  size_t sVar3;
  reference puVar4;
  size_t *psVar5;
  reference pvVar6;
  size_t *end;
  size_t *strideBegin;
  CoordinateOrder *coordinateOrder;
  Geometry<std::allocator<unsigned_long>_> *this_01;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar7;
  size_type local_108;
  size_t j_2;
  size_t j_1;
  undefined1 local_f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newStrides;
  undefined1 local_d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  value_type local_88;
  size_t j;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> s2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> s1;
  View<int,_false,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  
  this_local = (View<int,_false,_std::allocator<unsigned_long>_> *)begin._M_current;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  marray_detail::Assert<bool>(sVar3 != 0);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &s2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&it);
  j = (size_t)this_local;
  local_88 = 0;
  while( true ) {
    vVar2 = local_88;
    sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    if (sVar3 <= vVar2) break;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &s2._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_88);
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&j);
    pVar7 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &it,puVar4);
    newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pVar7.first._M_node;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&j);
    local_88 = local_88 + 1;
  }
  assertion = std::operator==((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)&s2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)&it);
  marray_detail::Assert<bool>(assertion);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&it);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &s2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  this_00 = (allocator<unsigned_long> *)
            ((long)&newStrides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,sVar3,this_00);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&newStrides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&j_1 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,sVar3,
             (allocator<unsigned_long> *)((long)&j_1 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&j_1 + 7));
  j_2 = 0;
  while( true ) {
    sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    if (sVar3 <= j_2) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&this_local);
    psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),*puVar4);
    sVar3 = *psVar5;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,j_2);
    *pvVar6 = sVar3;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&this_local);
    psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),*puVar4);
    sVar3 = *psVar5;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,j_2);
    *pvVar6 = sVar3;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&this_local);
    j_2 = j_2 + 1;
  }
  local_108 = 0;
  while( true ) {
    sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    if (sVar3 <= local_108) break;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,local_108)
    ;
    vVar1 = *pvVar6;
    psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_108);
    *psVar5 = vVar1;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,local_108)
    ;
    vVar1 = *pvVar6;
    psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_108);
    *psVar5 = vVar1;
    local_108 = local_108 + 1;
  }
  this_01 = (Geometry<std::allocator<unsigned_long>_> *)(this + 8);
  psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeBegin(this_01);
  end = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeEnd(this_01);
  strideBegin = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStridesBegin(this_01);
  coordinateOrder =
       marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder(this_01);
  marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>
            (psVar5,end,strideBegin,coordinateOrder);
  View<int,_false,_std::allocator<unsigned_long>_>::updateSimplicity
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  return;
}

Assistant:

void
View<T, isConst, A>::permute
(
    CoordinateIterator begin
)
{
    testInvariant();
    if(!MARRAY_NO_ARG_TEST) {
        marray_detail::Assert(dimension() != 0);
        std::set<std::size_t> s1, s2;
        CoordinateIterator it = begin;
        for(std::size_t j=0; j<dimension(); ++j) {
            s1.insert(j);
            s2.insert(*it);
            ++it;
        }
        marray_detail::Assert(s1 == s2);
    }
    // update shape, shape strides, strides, and simplicity
    std::vector<std::size_t> newShape = std::vector<std::size_t>(dimension());
    std::vector<std::size_t> newStrides = std::vector<std::size_t>(dimension());
    for(std::size_t j=0; j<dimension(); ++j) {
        newShape[j] = geometry_.shape(static_cast<std::size_t>(*begin));
        newStrides[j] = geometry_.strides(static_cast<std::size_t>(*begin));
        ++begin;
    }
    for(std::size_t j=0; j<dimension(); ++j) {
        geometry_.shape(j) = newShape[j];
        geometry_.strides(j) = newStrides[j];
    }
    marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(),
        geometry_.shapeStridesBegin(), geometry_.coordinateOrder());
    updateSimplicity();
    testInvariant();
}